

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

size_t __thiscall OPNMIDIplay::chooseDevice(OPNMIDIplay *this,string *name)

{
  vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_> *pvVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_bool>
  pVar5;
  MIDIchannel local_208;
  _Base_ptr local_c8;
  undefined1 local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_88;
  value_type local_60;
  OPNMIDIplay *local_38;
  size_t n;
  _Self local_28;
  iterator i;
  string *name_local;
  OPNMIDIplay *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->m_midiDevices,name);
  n = (size_t)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::end(&this->m_midiDevices);
  bVar2 = std::operator!=(&local_28,(_Self *)&n);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->(&local_28);
    this_local = (OPNMIDIplay *)ppVar3->second;
  }
  else {
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::size(&this->m_midiDevices);
    local_38 = (OPNMIDIplay *)(sVar4 << 4);
    std::__cxx11::string::string((string *)&local_a8,(string *)i._M_node);
    std::make_pair<std::__cxx11::string,unsigned_long>(&local_88,&local_a8,(unsigned_long)local_38);
    std::pair<std::__cxx11::string_const,unsigned_long>::pair<std::__cxx11::string,unsigned_long>
              ((pair<std::__cxx11::string_const,unsigned_long> *)&local_60,&local_88);
    pVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::insert(&this->m_midiDevices,&local_60);
    local_c8 = (_Base_ptr)pVar5.first._M_node;
    local_c0 = pVar5.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair(&local_60);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    pvVar1 = &local_38->m_midiChannels;
    MIDIchannel::MIDIchannel(&local_208);
    std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::resize
              (&this->m_midiChannels,
               (size_type)
               &(pvVar1->
                super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
    MIDIchannel::~MIDIchannel(&local_208);
    resetMIDIDefaults(this,(int)local_38);
    this_local = local_38;
  }
  return (size_t)this_local;
}

Assistant:

size_t OPNMIDIplay::chooseDevice(const std::string &name)
{
    std::map<std::string, size_t>::iterator i = m_midiDevices.find(name);

    if(i != m_midiDevices.end())
        return i->second;

    size_t n = m_midiDevices.size() * 16;
    m_midiDevices.insert(std::make_pair(name, n));
    m_midiChannels.resize(n + 16);
    resetMIDIDefaults(static_cast<int>(n));
    return n;
}